

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidx_manager.c
# Opt level: O2

opj_bool check_EPHuse(int coff,opj_marker_info_t *markers,int marknum,opj_cio_t *cio)

{
  long lVar1;
  int pos;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)marknum;
  if (marknum < 1) {
    uVar4 = 0;
  }
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (uVar4 * 0x18 + 0x18 == lVar3 + 0x18) {
      return 0;
    }
    lVar1 = lVar3 + 0x18;
  } while (*(short *)((long)&markers->type + lVar3) != -0xae);
  pos = cio_tell(cio);
  cio_seek(cio,coff + *(int *)((long)&markers->pos + lVar3) + 2);
  uVar2 = cio_read(cio,1);
  cio_seek(cio,pos);
  return uVar2 >> 2 & 1;
}

Assistant:

opj_bool check_EPHuse( int coff, opj_marker_info_t *markers, int marknum, opj_cio_t *cio)
{
  opj_bool EPHused = OPJ_FALSE;
  int i=0;
  int org_pos;
  unsigned int Scod;

  for(i = 0; i < marknum; i++){
    if( markers[i].type == J2K_MS_COD){
      org_pos = cio_tell( cio);
      cio_seek( cio, coff+markers[i].pos+2);
      
      Scod = cio_read( cio, 1);
      if( ((Scod >> 2) & 1))
	EPHused = OPJ_TRUE;
      cio_seek( cio, org_pos);

      break;
    }
  }    
  return EPHused;
}